

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O3

void tt_face_free_name(TT_Face face)

{
  TT_LangTagRec *pTVar1;
  FT_Memory memory;
  ulong uVar2;
  TT_NameRec *pTVar3;
  TT_NameRec *P;
  TT_LangTagRec *P_00;
  
  P = (face->name_table).names;
  memory = (((face->root).driver)->root).memory;
  if (P != (TT_NameRec *)0x0) {
    uVar2 = (ulong)(face->name_table).numNameRecords;
    if (uVar2 != 0) {
      pTVar3 = P + uVar2;
      do {
        ft_mem_free(memory,P->string);
        P->string = (FT_Byte *)0x0;
        P = P + 1;
      } while (P < pTVar3);
      P = (face->name_table).names;
    }
    ft_mem_free(memory,P);
    (face->name_table).names = (TT_NameRec *)0x0;
  }
  P_00 = (face->name_table).langTags;
  if (P_00 != (TT_LangTagRec *)0x0) {
    uVar2 = (ulong)(face->name_table).numLangTagRecords;
    if (uVar2 != 0) {
      pTVar1 = P_00 + uVar2;
      do {
        ft_mem_free(memory,P_00->string);
        P_00->string = (FT_Byte *)0x0;
        P_00 = P_00 + 1;
      } while (P_00 < pTVar1);
      P_00 = (face->name_table).langTags;
    }
    ft_mem_free(memory,P_00);
    (face->name_table).langTags = (TT_LangTagRec *)0x0;
  }
  (face->name_table).numNameRecords = 0;
  (face->name_table).storageOffset = 0;
  (face->name_table).numLangTagRecords = 0;
  (face->name_table).format = 0;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_face_free_name( TT_Face  face )
  {
    FT_Memory     memory = face->root.driver->root.memory;
    TT_NameTable  table  = &face->name_table;


    if ( table->names )
    {
      TT_Name  entry = table->names;
      TT_Name  limit = entry + table->numNameRecords;


      for ( ; entry < limit; entry++ )
        FT_FREE( entry->string );

      FT_FREE( table->names );
    }

    if ( table->langTags )
    {
      TT_LangTag  entry = table->langTags;
      TT_LangTag  limit = entry + table->numLangTagRecords;


      for ( ; entry < limit; entry++ )
        FT_FREE( entry->string );

      FT_FREE( table->langTags );
    }

    table->numNameRecords    = 0;
    table->numLangTagRecords = 0;
    table->format            = 0;
    table->storageOffset     = 0;
  }